

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O2

void __thiscall GeneticAlgorithm::resultToFile(GeneticAlgorithm *this)

{
  pointer pPVar1;
  char cVar2;
  ostream *poVar3;
  pointer pPVar4;
  Population p;
  ofstream myfile;
  
  std::ofstream::ofstream
            (&myfile,"C:\\Users\\alican\\ClionProjects\\GeneticAlgorithm\\viewer\\results.tsv",
             _S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    poVar3 = std::operator<<((ostream *)&myfile,"Generation");
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<(poVar3,"max fitness");
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<(poVar3,"min fitness");
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<(poVar3,"average fitness");
    std::operator<<(poVar3,"\n");
    pPVar1 = (this->generations).super__Vector_base<Population,_std::allocator<Population>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (pPVar4 = (this->generations).super__Vector_base<Population,_std::allocator<Population>_>.
                  _M_impl.super__Vector_impl_data._M_start; pPVar4 != pPVar1; pPVar4 = pPVar4 + 1) {
      Population::Population(&p,pPVar4);
      poVar3 = std::ostream::_M_insert<double>(p.minFitness);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>(p.maxFitness);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>(p.averageFitness);
      std::operator<<(poVar3,"\n");
      std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&p.chromosomes);
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&myfile);
  return;
}

Assistant:

void GeneticAlgorithm::resultToFile() {
    std::ofstream myfile ("C:\\Users\\alican\\ClionProjects\\GeneticAlgorithm\\viewer\\results.tsv");
    if (myfile.is_open())
    {
        myfile << "Generation" << "\t" << "max fitness" << "\t" << "min fitness" << "\t" << "average fitness" << "\n";
        for (auto p : generations){
            myfile << p.minFitness << "\t" << p.maxFitness << "\t" << p.averageFitness << "\n";
        };
        myfile.close();
    }
}